

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O2

void __thiscall LogWriter::reportEdge(LogWriter *this,uint v1,uint v2)

{
  size_type sVar1;
  mapped_type *pmVar2;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_00;
  uint local_38;
  uint local_34;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  this_00 = &this->vertices_;
  local_38 = v2;
  local_34 = v1;
  sVar1 = std::
          map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::count(this_00,&local_34);
  if (sVar1 == 0) {
    local_30._M_impl._M_node._M_size = 0;
    local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_30;
    pmVar2 = std::
             map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](this_00,&local_34);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (pmVar2,&local_30);
    std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_30);
  }
  sVar1 = std::
          map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::count(this_00,&local_38);
  if (sVar1 == 0) {
    local_30._M_impl._M_node._M_size = 0;
    local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_30;
    pmVar2 = std::
             map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](this_00,&local_38);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (pmVar2,&local_30);
    std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_30);
  }
  pmVar2 = std::
           map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](this_00,&local_34);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar2,&local_38);
  pmVar2 = std::
           map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](this_00,&local_38);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar2,&local_34);
  return;
}

Assistant:

void reportEdge(unsigned int v1, unsigned int v2) {
        if (vertices_.count(v1) == 0) vertices_[v1] = std::list<unsigned int>();
        if (vertices_.count(v2) == 0) vertices_[v2] = std::list<unsigned int>();

        vertices_[v1].push_back(v2);
        vertices_[v2].push_back(v1);
    }